

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O0

void WI_updateDeathmatchStats(void)

{
  bool bVar1;
  FSoundID local_2c;
  int local_28;
  FSoundID local_24;
  int i_1;
  FSoundID local_1c;
  FSoundID local_18;
  FSoundID local_14;
  byte local_e;
  char local_d;
  int local_c;
  bool autoskip;
  bool stillticking;
  int i;
  
  local_e = WI_autoSkip();
  WI_updateAnimatedBack();
  if (((acceleratestage != 0) || ((local_e & 1) != 0)) && (ng_state != 6)) {
    acceleratestage = 0;
    for (local_c = 0; local_c < 8; local_c = local_c + 1) {
      if ((playeringame[local_c] & 1U) != 0) {
        cnt_frags[local_c] = plrs[local_c].fragcount;
        cnt_deaths[local_c] = player_deaths[local_c];
      }
    }
    FSoundID::FSoundID(&local_14,"intermission/nextstage");
    S_Sound(0x22,&local_14,1.0,0.0);
    ng_state = 6;
  }
  if (ng_state == 2) {
    if ((bcnt & 3U) == 0) {
      FSoundID::FSoundID(&local_18,"intermission/tick");
      S_Sound(0x22,&local_18,1.0,0.0);
    }
    local_d = '\0';
    for (local_c = 0; local_c < 8; local_c = local_c + 1) {
      if ((playeringame[local_c] & 1U) != 0) {
        cnt_frags[local_c] = cnt_frags[local_c] + 2;
        if (plrs[local_c].fragcount < cnt_frags[local_c]) {
          cnt_frags[local_c] = plrs[local_c].fragcount;
        }
        else {
          local_d = '\x01';
        }
      }
    }
    if (local_d == '\0') {
      FSoundID::FSoundID(&local_1c,"intermission/nextstage");
      S_Sound(0x22,&local_1c,1.0,0.0);
      ng_state = ng_state + 1;
    }
  }
  else if (ng_state == 4) {
    if ((bcnt & 3U) == 0) {
      FSoundID::FSoundID((FSoundID *)&i_1,"intermission/tick");
      S_Sound(0x22,(FSoundID *)&i_1,1.0,0.0);
    }
    local_d = '\0';
    for (local_c = 0; local_c < 8; local_c = local_c + 1) {
      if ((playeringame[local_c] & 1U) != 0) {
        cnt_deaths[local_c] = cnt_deaths[local_c] + 2;
        if (player_deaths[local_c] < cnt_deaths[local_c]) {
          cnt_deaths[local_c] = player_deaths[local_c];
        }
        else {
          local_d = '\x01';
        }
      }
    }
    if (local_d == '\0') {
      FSoundID::FSoundID(&local_24,"intermission/nextstage");
      S_Sound(0x22,&local_24,1.0,0.0);
      ng_state = ng_state + 1;
    }
  }
  else if (ng_state == 6) {
    local_28 = 0;
    while ((local_28 < 8 &&
           ((((playeringame[local_28] & 1U) == 0 ||
             (bVar1 = TObjPtr<DBot>::operator==
                                ((TObjPtr<DBot> *)(&DAT_01ae7258 + (long)local_28 * 0x2a0),
                                 (DBot *)0x0), !bVar1)) || ((playerready[local_28] & 1U) != 0))))) {
      local_28 = local_28 + 1;
    }
    if (((local_28 == 8) && (acceleratestage != 0)) || ((local_e & 1) != 0)) {
      FSoundID::FSoundID(&local_2c,"intermission/pastdmstats");
      S_Sound(0x22,&local_2c,1.0,0.0);
      WI_initShowNextLoc();
    }
  }
  else if (((ng_state & 1U) != 0) && (cnt_pause = cnt_pause + -1, cnt_pause == 0)) {
    ng_state = ng_state + 1;
    cnt_pause = 0x23;
  }
  return;
}

Assistant:

void WI_updateDeathmatchStats ()
{

	int i;
	bool stillticking;
	bool autoskip = WI_autoSkip();

	WI_updateAnimatedBack();

	if ((acceleratestage || autoskip) && ng_state != 6)
	{
		acceleratestage = 0;

		for (i = 0; i<MAXPLAYERS; i++)
		{
			if (!playeringame[i])
				continue;

			cnt_frags[i] = plrs[i].fragcount;
			cnt_deaths[i] = player_deaths[i];
		}
		S_Sound(CHAN_VOICE | CHAN_UI, "intermission/nextstage", 1, ATTN_NONE);
		ng_state = 6;
	}

	if (ng_state == 2)
	{
		if (!(bcnt & 3))
			S_Sound(CHAN_VOICE | CHAN_UI, "intermission/tick", 1, ATTN_NONE);

		stillticking = false;

		for (i = 0; i<MAXPLAYERS; i++)
		{
			if (!playeringame[i])
				continue;

			cnt_frags[i] += 2;

			if (cnt_frags[i] > plrs[i].fragcount)
				cnt_frags[i] = plrs[i].fragcount;
			else
				stillticking = true;
		}

		if (!stillticking)
		{
			S_Sound(CHAN_VOICE | CHAN_UI, "intermission/nextstage", 1, ATTN_NONE);
			ng_state++;
		}
	}
	else if (ng_state == 4)
	{
		if (!(bcnt & 3))
			S_Sound(CHAN_VOICE | CHAN_UI, "intermission/tick", 1, ATTN_NONE);

		stillticking = false;

		for (i = 0; i<MAXPLAYERS; i++)
		{
			if (!playeringame[i])
				continue;

			cnt_deaths[i] += 2;
			if (cnt_deaths[i] > player_deaths[i])
				cnt_deaths[i] = player_deaths[i];
			else
				stillticking = true;
		}
		if (!stillticking)
		{
			S_Sound(CHAN_VOICE | CHAN_UI, "intermission/nextstage", 1, ATTN_NONE);
			ng_state++;
		}
	}
	else if (ng_state == 6)
	{
		int i;
		for (i = 0; i < MAXPLAYERS; i++)
		{
			// If the player is in the game and not ready, stop checking
			if (playeringame[i] && players[i].Bot == NULL && !playerready[i])
				break;
		}

		// All players are ready; proceed.
		if ((i == MAXPLAYERS && acceleratestage) || autoskip)
		{
			S_Sound(CHAN_VOICE | CHAN_UI, "intermission/pastdmstats", 1, ATTN_NONE);
			WI_initShowNextLoc();
		}
	}
	else if (ng_state & 1)
	{
		if (!--cnt_pause)
		{
			ng_state++;
			cnt_pause = TICRATE;
		}
	}
}